

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Decode.cpp
# Opt level: O3

void idx2::DecompressChunk(bitstream *ChunkStream,chunk_cache *ChunkCache,u64 ChunkAddress,int L)

{
  long *plVar1;
  byte *pbVar2;
  byte *pbVar3;
  i64 iVar4;
  allocator *paVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  unsigned_long uVar9;
  uint uVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  u32 V;
  u64 *puVar17;
  u64 *puVar18;
  ulong uVar19;
  u64 uVar20;
  byte *pbVar21;
  byte *pbVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int local_40;
  
  puVar18 = (u64 *)(ChunkStream->Stream).Data;
  ChunkStream->BitBuf = 0;
  ChunkStream->BitPtr = (byte *)puVar18;
  uVar20 = *puVar18;
  ChunkStream->BitBuf = uVar20;
  ChunkStream->BitPos = 0;
  uVar9 = bitstream::Masks.Arr[1];
  bVar11 = 0;
  uVar10 = 0;
  uVar25 = 0;
  do {
    puVar17 = puVar18;
    if (0x39 < (int)uVar10) {
      puVar17 = (u64 *)((long)puVar18 + (ulong)(uVar10 >> 3));
      ChunkStream->BitPtr = (byte *)puVar17;
      uVar20 = *(u64 *)((long)puVar18 + (ulong)(uVar10 >> 3));
      ChunkStream->BitBuf = uVar20;
      uVar10 = uVar10 & 7;
    }
    uVar23 = uVar20 >> ((byte)uVar10 & 0x3f) & bitstream::Masks.Arr[7];
    uVar16 = uVar10 + 7;
    puVar18 = puVar17;
    if (0x38 < (int)uVar10) {
      puVar18 = (u64 *)((long)puVar17 + (ulong)(uVar16 >> 3));
      ChunkStream->BitPtr = (byte *)puVar18;
      uVar20 = *(u64 *)((long)puVar17 + (ulong)(uVar16 >> 3));
      ChunkStream->BitBuf = uVar20;
      uVar16 = 0;
    }
    uVar25 = uVar25 + (uVar23 << (bVar11 & 0x3f));
    uVar10 = uVar16 + 1;
    bVar11 = bVar11 + 7;
  } while ((uVar20 >> ((byte)uVar16 & 0x3f) & uVar9) != 0);
  bVar11 = 0;
  lVar14 = 0;
  do {
    puVar17 = puVar18;
    if (0x39 < (int)uVar10) {
      puVar17 = (u64 *)((long)puVar18 + (ulong)(uVar10 >> 3));
      ChunkStream->BitPtr = (byte *)puVar17;
      uVar20 = *(u64 *)((long)puVar18 + (ulong)(uVar10 >> 3));
      ChunkStream->BitBuf = uVar20;
      uVar10 = uVar10 & 7;
    }
    uVar23 = uVar20 >> ((byte)uVar10 & 0x3f) & bitstream::Masks.Arr[7];
    uVar16 = uVar10 + 7;
    puVar18 = puVar17;
    if (0x38 < (int)uVar10) {
      puVar18 = (u64 *)((long)puVar17 + (ulong)(uVar16 >> 3));
      ChunkStream->BitPtr = (byte *)puVar18;
      uVar20 = *(u64 *)((long)puVar17 + (ulong)(uVar16 >> 3));
      ChunkStream->BitBuf = uVar20;
      uVar16 = 0;
    }
    lVar14 = lVar14 + (uVar23 << (bVar11 & 0x3f));
    uVar10 = uVar16 + 1;
    bVar11 = bVar11 + 7;
  } while ((uVar20 >> ((byte)uVar16 & 0x3f) & uVar9) != 0);
  ChunkStream->BitPos = uVar10;
  iVar12 = (int)uVar25;
  Resize<unsigned_long>(&ChunkCache->Bricks,(long)iVar12);
  plVar1 = (long *)(ChunkCache->Bricks).Buffer.Data;
  *plVar1 = lVar14;
  if (iVar12 != 1) {
    uVar10 = ChunkStream->BitPos;
    uVar23 = 1;
    do {
      uVar9 = bitstream::Masks.Arr[1];
      uVar20 = ChunkStream->BitBuf;
      uVar19 = 0;
      do {
        if (0x3f < (int)uVar10) {
          pbVar22 = ChunkStream->BitPtr;
          ChunkStream->BitPtr = pbVar22 + (uVar10 >> 3);
          uVar20 = *(u64 *)(pbVar22 + (uVar10 >> 3));
          ChunkStream->BitBuf = uVar20;
          uVar10 = uVar10 & 7;
        }
        bVar11 = (byte)uVar10;
        uVar10 = uVar10 + 1;
        uVar19 = (ulong)((int)uVar19 + 1);
      } while ((uVar20 >> (bVar11 & 0x3f) & uVar9) == 0);
      lVar14 = lVar14 + uVar19;
      plVar1[uVar23] = lVar14;
      uVar23 = uVar23 + 1;
    } while (uVar23 != (uVar25 & 0xffffffff));
    ChunkStream->BitPos = uVar10;
  }
  Resize<int>(&ChunkCache->BrickOffsets,(long)iVar12);
  pbVar2 = (ChunkStream->Stream).Data;
  pbVar3 = ChunkStream->BitPtr;
  iVar12 = ChunkStream->BitPos + 7 >> 3;
  pbVar22 = pbVar3 + iVar12;
  ChunkStream->BitPtr = pbVar22;
  uVar25 = *(ulong *)(pbVar3 + iVar12);
  ChunkStream->BitBuf = uVar25;
  iVar12 = 0;
  ChunkStream->BitPos = 0;
  pbVar3 = (ChunkCache->BrickOffsets).Buffer.Data;
  pbVar3[0] = '\0';
  uVar9 = bitstream::Masks.Arr[1];
  pbVar3[1] = '\0';
  pbVar3[2] = '\0';
  pbVar3[3] = '\0';
  lVar14 = (ChunkCache->BrickOffsets).Size;
  if (lVar14 != 1) {
    lVar15 = 1;
    do {
      uVar10 = ChunkStream->BitPos;
      bVar11 = 0;
      lVar24 = 0;
      do {
        pbVar21 = pbVar22;
        if (0x39 < (int)uVar10) {
          pbVar21 = pbVar22 + (uVar10 >> 3);
          ChunkStream->BitPtr = pbVar21;
          uVar25 = *(ulong *)(pbVar22 + (uVar10 >> 3));
          ChunkStream->BitBuf = uVar25;
          uVar10 = uVar10 & 7;
        }
        uVar23 = uVar25 >> ((byte)uVar10 & 0x3f) & bitstream::Masks.Arr[7];
        uVar16 = uVar10 + 7;
        pbVar22 = pbVar21;
        if (0x38 < (int)uVar10) {
          pbVar22 = pbVar21 + (uVar16 >> 3);
          ChunkStream->BitPtr = pbVar22;
          uVar25 = *(ulong *)(pbVar21 + (uVar16 >> 3));
          ChunkStream->BitBuf = uVar25;
          uVar16 = 0;
        }
        lVar24 = lVar24 + (uVar23 << (bVar11 & 0x3f));
        uVar10 = uVar16 + 1;
        bVar11 = bVar11 + 7;
      } while ((uVar25 >> ((byte)uVar16 & 0x3f) & uVar9) != 0);
      ChunkStream->BitPos = uVar10;
      iVar12 = iVar12 + (int)lVar24;
      *(int *)(pbVar3 + lVar15 * 4) = iVar12;
      lVar15 = lVar15 + 1;
    } while (lVar14 != lVar15);
  }
  uVar10 = ChunkStream->BitPos;
  do {
    if ((int)uVar10 < 0x3a) {
      if (uVar10 == 0x39) {
        ChunkStream->BitPtr = pbVar22 + 8;
        uVar25 = *(ulong *)(pbVar22 + 8);
        ChunkStream->BitBuf = uVar25;
        iVar12 = 0;
        pbVar22 = pbVar22 + 8;
      }
      else {
        iVar12 = uVar10 + 7;
      }
    }
    else {
      ChunkStream->BitPtr = pbVar22 + (uVar10 >> 3);
      uVar25 = *(ulong *)(pbVar22 + (uVar10 >> 3));
      ChunkStream->BitBuf = uVar25;
      iVar12 = (uVar10 & 7) + 7;
      pbVar22 = pbVar22 + (uVar10 >> 3);
    }
    uVar10 = iVar12 + 1;
  } while ((uVar25 >> ((byte)iVar12 & 0x3f) & uVar9) != 0);
  ChunkStream->BitPos = uVar10;
  if (lVar14 != 0) {
    local_40 = (int)pbVar2;
    lVar15 = 0;
    do {
      iVar12 = ChunkStream->BitPos + 7;
      iVar13 = ChunkStream->BitPos + 0xe;
      if (-1 < iVar12) {
        iVar13 = iVar12;
      }
      *(int *)(pbVar3 + lVar15) =
           *(int *)(pbVar3 + lVar15) + ((int)pbVar22 - local_40) + (iVar13 >> 3);
      lVar15 = lVar15 + 4;
    } while (lVar14 << 2 != lVar15);
  }
  pbVar22 = (ChunkStream->Stream).Data;
  iVar4 = (ChunkStream->Stream).Bytes;
  paVar5 = (ChunkStream->Stream).Alloc;
  pbVar2 = ChunkStream->BitPtr;
  uVar6 = *(undefined8 *)((long)&(ChunkStream->Stream).Alloc + 4);
  uVar7 = *(undefined8 *)((long)&ChunkStream->BitPtr + 4);
  uVar8 = *(undefined8 *)((long)&ChunkStream->BitBuf + 4);
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).Stream.Bytes + 4) =
       *(undefined8 *)((long)&(ChunkStream->Stream).Bytes + 4);
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).Stream.Alloc + 4) = uVar6;
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).BitPtr + 4) = uVar7;
  *(undefined8 *)((long)&(ChunkCache->ChunkStream).BitBuf + 4) = uVar8;
  (ChunkCache->ChunkStream).Stream.Data = pbVar22;
  (ChunkCache->ChunkStream).Stream.Bytes = iVar4;
  (ChunkCache->ChunkStream).Stream.Alloc = paVar5;
  (ChunkCache->ChunkStream).BitPtr = pbVar2;
  return;
}

Assistant:

void
DecompressChunk(bitstream* ChunkStream, chunk_cache* ChunkCache, u64 ChunkAddress, int L)
{
  (void)L;
  u64 Brk = ((ChunkAddress >> 18) & 0x3FFFFFFFFFFull);
  (void)Brk;
  InitRead(ChunkStream, ChunkStream->Stream);
  int NBricks = (int)ReadVarByte(ChunkStream);
  idx2_Assert(NBricks > 0);

  /* decompress and store the brick ids */
  u64 Brick = ReadVarByte(ChunkStream);
  Resize(&ChunkCache->Bricks, NBricks);
  ChunkCache->Bricks[0] = Brick;
  idx2_For (int, I, 1, NBricks)
  {
    Brick += ReadUnary(ChunkStream) + 1;
    ChunkCache->Bricks[I] = Brick;
    idx2_Assert(Brk == (Brick >> L));
  }

  Resize(&ChunkCache->BrickOffsets, NBricks);
  /* decompress and store the brick sizes */
  i32 BrickSize = 0;
  SeekToNextByte(ChunkStream);
  ChunkCache->BrickOffsets[0] = 0;
  idx2_For (int, I, 1, Size(ChunkCache->BrickOffsets))
  {
    ChunkCache->BrickOffsets[I] = (BrickSize += (i32)ReadVarByte(ChunkStream));
  }
  ReadVarByte(ChunkStream); // the size of the last brick (ignored here)
  idx2_ForEach (BrickSzIt, ChunkCache->BrickOffsets)
    *BrickSzIt += (i32)Size(*ChunkStream);
  ChunkCache->ChunkStream = *ChunkStream;
}